

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

JSON_Value * jag_FindFirstNonNull(JSON_Array *pArr,initializer_list<unsigned_long> aIdx)

{
  bool bVar1;
  JSON_Value_Type JVar2;
  JSON_Value *value;
  long lVar3;
  JSON_Value *unaff_R12;
  
  if (aIdx._M_len != 0) {
    lVar3 = 0;
    do {
      value = json_array_get_value(pArr,*(size_t *)((long)aIdx._M_array + lVar3));
      if ((value == (JSON_Value *)0x0) || (JVar2 = json_value_get_type(value), JVar2 == 1)) {
        bVar1 = true;
        value = unaff_R12;
      }
      else {
        bVar1 = false;
      }
      if (!bVar1) {
        return value;
      }
      lVar3 = lVar3 + 8;
      unaff_R12 = value;
    } while (aIdx._M_len << 3 != lVar3);
  }
  return (JSON_Value *)0x0;
}

Assistant:

JSON_Value* jag_FindFirstNonNull(const JSON_Array* pArr, std::initializer_list<size_t> aIdx)
{
    for (size_t i: aIdx) {
        JSON_Value* pVal = json_array_get_value(pArr, i);
        if (pVal && json_value_get_type(pVal) != JSONNull)
            return pVal;
    }
    return nullptr;
}